

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::stop_election_timer(raft_server *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  long in_RDI;
  ptr<delayed_task> *in_stack_ffffffffffffffa8;
  raft_server *in_stack_ffffffffffffffb0;
  string local_28 [40];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 400));
  if (bVar1) {
    cancel_task(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x498192);
      iVar2 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (2 < iVar2) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4981b5);
        msg_if_given_abi_cxx11_
                  ((char *)local_28,
                   "Election Timer is never started but is requested to stop, protential a bug");
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"stop_election_timer",0xc1,local_28);
        std::__cxx11::string::~string(local_28);
      }
    }
  }
  return;
}

Assistant:

void raft_server::stop_election_timer() {
    if (!election_task_) {
        p_wn("Election Timer is never started but is "
             "requested to stop, protential a bug");
        return;
    }

    cancel_task(election_task_);
}